

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

gc_heap_ptr<mjs::interpreter::impl::scope> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::interpreter::impl::scope,mjs::gc_heap_ptr<mjs::object>const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&>
          (gc_heap *this,size_t num_bytes,gc_heap_ptr<mjs::object> *args,
          gc_heap_ptr<mjs::interpreter::impl::scope> *args_1)

{
  slot *this_00;
  undefined8 extraout_RDX;
  scope_ptr *in_R8;
  allocation_result aVar1;
  gc_heap_ptr<mjs::interpreter::impl::scope> gVar2;
  
  aVar1 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  this_00 = aVar1.obj;
  if (((gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>,_true>
        *)((long)this_00 + -4))->pos_ == 0xffffffff) {
    interpreter::impl::scope::scope((scope *)&this_00->allocation,(object_ptr *)args_1,in_R8);
    ((gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>,_true> *
     )((long)this_00 + -4))->pos_ =
         gc_type_info_registration<mjs::interpreter::impl::scope>::reg._40_4_;
    (this->pointers_).set_ = (gc_heap_ptr_untyped **)num_bytes;
    (this->pointers_).capacity_ = aVar1.pos;
    attach((gc_heap *)num_bytes,(gc_heap_ptr_untyped *)this);
    gVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar2.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::interpreter::impl::scope>)gVar2.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::interpreter::impl::scope, Args = <const mjs::gc_heap_ptr<mjs::object> &, const mjs::gc_heap_ptr<mjs::interpreter::impl::scope> &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}